

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O1

QStandardItem * __thiscall QStandardItem::takeChild(QStandardItem *this,int row,int column)

{
  QList<QStandardItem_*> *this_00;
  int count;
  QStandardItemPrivate *pQVar1;
  QStandardItemPrivate *this_01;
  QStandardItemModelPrivate *this_02;
  QStandardItemPrivate *this_03;
  pair<int,_int> pVar2;
  int iVar3;
  int iVar4;
  QStandardItem *parent;
  QAbstractItemModel *pQVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QStandardItem_*> local_98;
  QArrayDataPointer<QStandardItem_*> local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  iVar3 = -1;
  if (((-1 < (column | row)) && (row < pQVar1->rows)) && (column < pQVar1->columns)) {
    iVar3 = pQVar1->columns * row + column;
  }
  if (iVar3 == -1) {
    parent = (QStandardItem *)0x0;
  }
  else {
    local_58.r = -1;
    local_58.c = -1;
    local_58.i = 0;
    local_58.m.ptr = (QAbstractItemModel *)0x0;
    parent = (pQVar1->children).d.ptr[iVar3];
    if (parent != (QStandardItem *)0x0) {
      this_01 = (parent->d_ptr).d;
      if (pQVar1->model != (QStandardItemModel *)0x0) {
        this_02 = *(QStandardItemModelPrivate **)&pQVar1->model->field_0x8;
        iVar4 = this_01->rows;
        count = this_01->columns;
        local_78.d = (this_01->children).d.d;
        local_78.ptr = (this_01->children).d.ptr;
        local_78.size = (this_01->children).d.size;
        if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_78.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_78.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        this_00 = &this_01->children;
        if (0 < iVar4) {
          QStandardItemModelPrivate::rowsAboutToBeRemoved(this_02,parent,0,iVar4 + -1);
          this_01->rows = 0;
          local_98.d = (Data *)0x0;
          local_98.ptr = (QStandardItem **)0x0;
          local_98.size = 0;
          QArrayDataPointer<QStandardItem_*>::operator=(&this_00->d,&local_98);
          if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_98.d)->super_QArrayData,8,0x10);
            }
          }
          QStandardItemModelPrivate::rowsRemoved(this_02,parent,0,iVar4);
        }
        if (0 < count) {
          QStandardItemModelPrivate::columnsAboutToBeRemoved(this_02,parent,0,count + -1);
          this_01->columns = 0;
          local_98.d = (Data *)0x0;
          local_98.ptr = (QStandardItem **)0x0;
          local_98.size = 0;
          QArrayDataPointer<QStandardItem_*>::operator=(&this_00->d,&local_98);
          if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_98.d)->super_QArrayData,8,0x10);
            }
          }
          QStandardItemModelPrivate::columnsRemoved(this_02,parent,0,count);
        }
        this_01->rows = iVar4;
        this_01->columns = count;
        QArrayDataPointer<QStandardItem_*>::operator=(&this_00->d,&local_78);
        this_03 = (parent->d_ptr).d;
        if (this_03->parent == (QStandardItem *)0x0) {
          iVar4 = -1;
          local_58.i = 0;
          pQVar5 = (QAbstractItemModel *)0x0;
          pVar2.first = -1;
          pVar2.second = 0;
        }
        else {
          pQVar5 = &pQVar1->model->super_QAbstractItemModel;
          pVar2 = QStandardItemPrivate::position(this_03);
          iVar4 = pVar2.second;
          local_58.i = (quintptr)((parent->d_ptr).d)->parent;
        }
        local_58._0_8_ = CONCAT44(iVar4,pVar2.first);
        local_58.m.ptr = pQVar5;
        if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d)->super_QArrayData,8,0x10);
          }
        }
      }
      QStandardItemPrivate::setModel(this_01,(QStandardItemModel *)0x0);
      this_01->parent = (QStandardItem *)0x0;
    }
    QList<QStandardItem_*>::replace(&pQVar1->children,(long)iVar3,(parameter_type)0x0);
    if (((-1 < local_58.r) && (-1 < (long)local_58._0_8_)) &&
       (local_58.m.ptr != (QAbstractItemModel *)0x0)) {
      local_78.d = (Data *)0x0;
      local_78.ptr = (QStandardItem **)0x0;
      local_78.size = 0;
      QAbstractItemModel::dataChanged
                ((QModelIndex *)pQVar1->model,&local_58,(QList_conflict *)&local_58);
      if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d)->super_QArrayData,4,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return parent;
  }
  __stack_chk_fail();
}

Assistant:

QStandardItem *QStandardItem::takeChild(int row, int column)
{
    Q_D(QStandardItem);
    QStandardItem *item = nullptr;
    int index = d->childIndex(row, column);
    if (index != -1) {
        QModelIndex changedIdx;
        item = d->children.at(index);
        if (item) {
            QStandardItemPrivate *const item_d = item->d_func();
            if (d->model) {
                QStandardItemModelPrivate *const model_d = d->model->d_func();
                const int savedRows = item_d->rows;
                const int savedCols = item_d->columns;
                const QVector<QStandardItem*> savedChildren = item_d->children;
                if (savedRows > 0) {
                    model_d->rowsAboutToBeRemoved(item, 0, savedRows - 1);
                    item_d->rows = 0;
                    item_d->children = QVector<QStandardItem*>(); //slightly faster than clear
                    model_d->rowsRemoved(item, 0, savedRows);
                }
                if (savedCols > 0) {
                    model_d->columnsAboutToBeRemoved(item, 0, savedCols - 1);
                    item_d->columns = 0;
                    item_d->children = QVector<QStandardItem*>(); //slightly faster than clear
                    model_d->columnsRemoved(item, 0, savedCols);
                }
                item_d->rows = savedRows;
                item_d->columns = savedCols;
                item_d->children = savedChildren;
                changedIdx = d->model->indexFromItem(item);
            }
            item_d->setParentAndModel(nullptr, nullptr);
        }
        d->children.replace(index, nullptr);
        if (changedIdx.isValid())
            d->model->dataChanged(changedIdx, changedIdx);
    }
    return item;
}